

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.hpp
# Opt level: O1

data_ptr_t __thiscall duckdb::ArenaAllocator::Allocate(ArenaAllocator *this,idx_t len)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  
  _Var1._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl == (ArenaChunk *)0x0) ||
     ((_Var1._M_head_impl)->maximum_size < (_Var1._M_head_impl)->current_position + len)) {
    AllocateNewBlock(this,len);
  }
  _Var1._M_head_impl =
       (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  iVar2 = (_Var1._M_head_impl)->current_position;
  pdVar3 = *(data_ptr_t *)((long)&(_Var1._M_head_impl)->data + 8);
  (_Var1._M_head_impl)->current_position = len + iVar2;
  return pdVar3 + iVar2;
}

Assistant:

data_ptr_t Allocate(idx_t len) {
		D_ASSERT(!head || head->current_position <= head->maximum_size);
		if (!head || head->current_position + len > head->maximum_size) {
			AllocateNewBlock(len);
		}
		D_ASSERT(head->current_position + len <= head->maximum_size);
		auto result = head->data.get() + head->current_position;
		head->current_position += len;
		return result;
	}